

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

int pnga_sprs_array_access_col_block_idx
              (Integer s_a,Integer icol,AccessIndex *idx,AccessIndex *jdx,AccessIndex *vdx)

{
  long lVar1;
  long *in_RCX;
  long *in_RDX;
  long in_RDI;
  long *in_R8;
  unsigned_long lptr;
  unsigned_long lref;
  Integer *jptr;
  Integer *iptr;
  void *vptr;
  Integer s_hdl;
  long local_50;
  long local_48;
  long local_40;
  int local_4;
  
  lVar1 = in_RDI + 1000;
  pnga_sprs_array_access_col_block(s_hdl,(Integer)vptr,iptr,jptr,(void *)lref);
  if (((local_48 == 0) && (local_50 == 0)) && (local_40 == 0)) {
    *in_RDX = 0;
    *in_RCX = 0;
    *in_R8 = 0;
    local_4 = 0;
  }
  else {
    *in_RDX = local_48 - (long)INT_MB >> 3;
    *in_RCX = local_50 - (long)INT_MB >> 3;
    if ((SPA[lVar1].type == 0x3e9) || (SPA[lVar1].type == 0x3ea)) {
      *in_R8 = local_40 - (long)INT_MB >> 3;
    }
    else if (SPA[lVar1].type == 0x3eb) {
      *in_R8 = local_40 - (long)FLT_MB >> 2;
    }
    else if (SPA[lVar1].type == 0x3ec) {
      *in_R8 = local_40 - (long)DBL_MB >> 3;
    }
    else if (SPA[lVar1].type == 0x3ee) {
      *in_R8 = local_40 - (long)SCPL_MB >> 3;
    }
    else if (SPA[lVar1].type == 0x3ef) {
      *in_R8 = local_40 - (long)DCPL_MB >> 4;
    }
    *in_RDX = *in_RDX + 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int pnga_sprs_array_access_col_block_idx(Integer s_a, Integer icol,
    AccessIndex *idx, AccessIndex *jdx, AccessIndex *vdx)
{
  Integer s_hdl = GA_OFFSET + s_a;
  void *vptr;
  Integer *iptr, *jptr;
  unsigned long lref=0, lptr;
  pnga_sprs_array_access_col_block(s_a, icol, &iptr, &jptr, &vptr);
  /* iproc corresponds to a block with no data */
  if (iptr == NULL && jptr == NULL && vptr == NULL) {
    *idx = 0;
    *jdx = 0;
    *vdx = 0;
    return 0;
  }
  *idx = (AccessIndex) ((Integer*)iptr - INT_MB);
  *jdx = (AccessIndex) ((Integer*)jptr - INT_MB);
  lref = (unsigned long)INT_MB;
  /* if that array data is a fortran integer then it will be set to either the
   * C int or long data type */
  if (SPA[s_hdl].type == C_INT || SPA[s_hdl].type == C_LONG) {
    *vdx = (AccessIndex) ((Integer*)vptr - INT_MB);
  } else if (SPA[s_hdl].type == C_FLOAT) {
    *vdx = (AccessIndex) ((float*)vptr - FLT_MB);
  } else if (SPA[s_hdl].type == C_DBL) {
    *vdx = (AccessIndex) ((double*)vptr - DBL_MB);
  } else if (SPA[s_hdl].type == C_SCPL) {
    *vdx = (AccessIndex) ((SingleComplex*)vptr - SCPL_MB);
  } else if (SPA[s_hdl].type == C_DCPL) {
    *vdx = (AccessIndex) ((DoubleComplex*)vptr - DCPL_MB);
  }

#ifdef BYTE_ADDRESSABLE_MEMORY
    /* check the allignment */
    lptr = (unsigned long)vptr;
    if( lptr%elemsize != lref%elemsize ){
      printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
          lref,lref%elemsize);
      pnga_error("sprs_array_access_col_block: MA addressing problem: base address misallignment",
          handle);
    }
#endif

    /* adjust index for Fortran addressing */
    (*idx) ++ ;
    FLUSH_CACHE;
    return 1;
}